

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O3

FilePath *
testing::internal::FilePath::MakeFileName
          (FilePath *__return_storage_ptr__,FilePath *directory,FilePath *base_name,int number,
          char *extension)

{
  undefined8 *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 *puVar4;
  long *plVar5;
  size_type *psVar6;
  ulong uVar7;
  undefined8 uVar8;
  ulong *puVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string file;
  int local_f4;
  ulong *local_f0;
  long local_e8;
  ulong local_e0;
  long lStack_d8;
  FilePath local_d0;
  undefined8 *local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  string local_70;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_f4 = number;
  if (number == 0) {
    pcVar3 = (base_name->pathname_)._M_dataplus._M_p;
    local_f0 = &local_e0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f0,pcVar3,pcVar3 + (base_name->pathname_)._M_string_length);
    std::__cxx11::string::append((char *)&local_f0);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_f0);
    paVar2 = &local_d0.pathname_.field_2;
    psVar6 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_d0.pathname_.field_2._M_allocated_capacity = *psVar6;
      local_d0.pathname_.field_2._8_8_ = plVar5[3];
      local_d0.pathname_._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_d0.pathname_.field_2._M_allocated_capacity = *psVar6;
      local_d0.pathname_._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_d0.pathname_._M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_50,(string *)&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0.pathname_._M_dataplus._M_p != paVar2) {
      operator_delete(local_d0.pathname_._M_dataplus._M_p);
    }
    puVar9 = local_f0;
    if (local_f0 == &local_e0) goto LAB_0013356e;
  }
  else {
    pcVar3 = (base_name->pathname_)._M_dataplus._M_p;
    local_90 = local_80;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,pcVar3,pcVar3 + (base_name->pathname_)._M_string_length);
    std::__cxx11::string::append((char *)&local_90);
    StreamableToString<int>(&local_70,&local_f4);
    uVar7 = 0xf;
    if (local_90 != local_80) {
      uVar7 = local_80[0];
    }
    if (uVar7 < local_70._M_string_length + local_88) {
      uVar8 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        uVar8 = local_70.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar8 < local_70._M_string_length + local_88) goto LAB_0013338f;
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_90);
    }
    else {
LAB_0013338f:
      puVar4 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_70._M_dataplus._M_p);
    }
    local_b0 = &local_a0;
    puVar1 = puVar4 + 2;
    if ((undefined8 *)*puVar4 == puVar1) {
      local_a0 = *puVar1;
      uStack_98 = puVar4[3];
    }
    else {
      local_a0 = *puVar1;
      local_b0 = (undefined8 *)*puVar4;
    }
    local_a8 = puVar4[1];
    *puVar4 = puVar1;
    puVar4[1] = 0;
    *(undefined1 *)puVar1 = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_b0);
    puVar9 = (ulong *)(plVar5 + 2);
    if ((ulong *)*plVar5 == puVar9) {
      local_e0 = *puVar9;
      lStack_d8 = plVar5[3];
      local_f0 = &local_e0;
    }
    else {
      local_e0 = *puVar9;
      local_f0 = (ulong *)*plVar5;
    }
    local_e8 = plVar5[1];
    *plVar5 = (long)puVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_f0);
    paVar2 = &local_d0.pathname_.field_2;
    psVar6 = puVar4 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_d0.pathname_.field_2._M_allocated_capacity = *psVar6;
      local_d0.pathname_.field_2._8_8_ = puVar4[3];
      local_d0.pathname_._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_d0.pathname_.field_2._M_allocated_capacity = *psVar6;
      local_d0.pathname_._M_dataplus._M_p = (pointer)*puVar4;
    }
    local_d0.pathname_._M_string_length = puVar4[1];
    *puVar4 = psVar6;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_50,(string *)&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0.pathname_._M_dataplus._M_p != paVar2) {
      operator_delete(local_d0.pathname_._M_dataplus._M_p);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0);
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    puVar9 = local_90;
    if (local_90 == local_80) goto LAB_0013356e;
  }
  operator_delete(puVar9);
LAB_0013356e:
  FilePath(&local_d0,&local_50);
  ConcatPaths(__return_storage_ptr__,directory,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.pathname_._M_dataplus._M_p != &local_d0.pathname_.field_2) {
    operator_delete(local_d0.pathname_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

FilePath FilePath::MakeFileName(const FilePath& directory,
                                const FilePath& base_name,
                                int number,
                                const char* extension) {
  std::string file;
  if (number == 0) {
    file = base_name.string() + "." + extension;
  } else {
    file = base_name.string() + "_" + StreamableToString(number)
        + "." + extension;
  }
  return ConcatPaths(directory, FilePath(file));
}